

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O0

void WebRatesB(sunrealtype x,sunrealtype y,sunrealtype t,sunrealtype *c,sunrealtype *cB,
              sunrealtype *rate,sunrealtype *rateB,WebData wdata)

{
  int iVar1;
  sunrealtype (*acoef) [6];
  sunrealtype *bcoef;
  sunrealtype fac;
  int ns;
  int j;
  int i;
  WebData wdata_local;
  sunrealtype *rateB_local;
  sunrealtype *rate_local;
  sunrealtype *cB_local;
  sunrealtype *c_local;
  sunrealtype t_local;
  sunrealtype y_local;
  sunrealtype x_local;
  
  iVar1 = wdata->ns;
  for (i = 0; i < iVar1; i = i + 1) {
    rate[i] = wdata->bcoef[i] * (x * 1.0 * y + 1.0);
  }
  for (j = 0; j < iVar1; j = j + 1) {
    for (i = 0; i < iVar1; i = i + 1) {
      rate[i] = wdata->acoef[i][j] * c[j] + rate[i];
    }
  }
  for (i = 0; i < iVar1; i = i + 1) {
    rateB[i] = cB[i] * rate[i];
    rate[i] = c[i] * rate[i];
  }
  for (j = 0; j < iVar1; j = j + 1) {
    for (i = 0; i < iVar1; i = i + 1) {
      rateB[i] = wdata->acoef[j][i] * c[j] * cB[j] + rateB[i];
    }
  }
  return;
}

Assistant:

static void WebRatesB(sunrealtype x, sunrealtype y, sunrealtype t,
                      sunrealtype c[], sunrealtype cB[], sunrealtype rate[],
                      sunrealtype rateB[], WebData wdata)
{
  int i, j, ns;
  sunrealtype fac, *bcoef;
  sunrealtype(*acoef)[NS];

  ns    = wdata->ns;
  acoef = wdata->acoef;
  bcoef = wdata->bcoef;

  fac = ONE + ALPH * x * y;

  for (i = 0; i < ns; i++) { rate[i] = bcoef[i] * fac; }

  for (j = 0; j < ns; j++)
  {
    for (i = 0; i < ns; i++) { rate[i] += acoef[i][j] * c[j]; }
  }

  for (i = 0; i < ns; i++)
  {
    rateB[i] = cB[i] * rate[i];
    rate[i]  = c[i] * rate[i];
  }

  for (j = 0; j < ns; j++)
  {
    for (i = 0; i < ns; i++) { rateB[i] += acoef[j][i] * c[j] * cB[j]; }
  }
}